

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

ssize_t __thiscall
TCPConnection::recv(TCPConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t __netlong;
  ostream *this_00;
  TCPConnection *pTVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  TCPConnection *extraout_RAX;
  undefined7 extraout_var_02;
  reference pvVar5;
  undefined7 extraout_var_03;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  int iVar9;
  uchar *puVar10;
  initializer_list<unsigned_short> masks;
  initializer_list<unsigned_short> masks_00;
  initializer_list<unsigned_short> masks_01;
  initializer_list<unsigned_short> masks_02;
  initializer_list<unsigned_short> masks_03;
  initializer_list<unsigned_short> masks_04;
  ushort local_1ae;
  type local_198;
  thread local_190;
  undefined1 local_182 [26];
  TCPConnection *local_168;
  undefined8 local_160;
  iterator local_158;
  iterator local_138;
  const_iterator local_118;
  undefined8 local_f8;
  uint8_t *payload;
  unique_lock<std::mutex> lck;
  undefined1 local_d8 [8];
  unique_lock<std::mutex> lck1;
  uint32_t next_seq;
  tcp_t *packet;
  value_type *p;
  unique_lock<std::mutex> lck0;
  uint32_t acked;
  undefined1 local_82 [24];
  uint16_t local_6a;
  TCPConnection *local_68;
  undefined8 local_60;
  undefined1 local_52 [26];
  size_t payload_size;
  uint16_t header_len;
  uint16_t *puStack_30;
  uint16_t flags;
  tcp_t *tcp;
  void *pvStack_20;
  uint32_t from_ip_local;
  size_t len_local;
  uint8_t *data_local;
  TCPConnection *this_local;
  
  uVar8 = (ulong)(uint)__flags;
  puStack_30 = (uint16_t *)CONCAT44(in_register_00000034,__fd);
  tcp._4_4_ = (undefined4)__n;
  payload_size._6_2_ = puStack_30[6];
  payload_size._4_2_ = (ushort)(((int)(payload_size._6_2_ & 0xf0) >> 4) << 2);
  pvStack_20 = __buf;
  len_local = (size_t)puStack_30;
  data_local = (uint8_t *)this;
  if (__buf < (void *)(ulong)payload_size._4_2_) {
    this_00 = std::operator<<((ostream *)&std::cerr,"malformed TCP segment. Size too small.");
    pTVar4 = (TCPConnection *)
             std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    lVar6 = (long)__buf - (ulong)payload_size._4_2_;
    local_52._18_8_ = lVar6;
    if (this->state_ == CLOSED) {
      bVar1 = has_ack(payload_size._6_2_);
      if (bVar1) {
        local_52._0_2_ = 0x400;
        local_52._2_8_ = local_52;
        local_52._10_8_ = 1;
        masks._M_len = 0x14;
        masks._M_array = (iterator)0x1;
        local_1ae = get_flags((TCPConnection *)local_52._2_8_,masks,(uint16_t)lVar6);
      }
      else {
        local_82._22_2_ = 0x400;
        local_6a = 0x1000;
        local_68 = (TCPConnection *)(local_82 + 0x16);
        local_60 = 2;
        masks_00._M_len = 0x14;
        masks_00._M_array = (iterator)0x2;
        local_1ae = get_flags(local_68,masks_00,(uint16_t)lVar6);
      }
      uVar2 = ntohs(puStack_30[1]);
      ntohs(*puStack_30);
      has_ack(payload_size._6_2_);
      bVar1 = has_ack(payload_size._6_2_);
      if (!bVar1) {
        nl_add_hl(*(uint32_t *)(puStack_30 + 2),local_52._18_4_);
      }
      pTVar4 = (TCPConnection *)send(this,0,(void *)0x0,(ulong)local_1ae,(uint)uVar2);
    }
    else if (this->state_ == SYN_SENT) {
      has_ack(payload_size._6_2_);
      uVar3 = (uint16_t)lVar6;
      bVar1 = has_rst(payload_size._6_2_);
      if (bVar1) {
        bVar1 = has_ack(payload_size._6_2_);
        pTVar4 = (TCPConnection *)CONCAT71(extraout_var,bVar1);
        if (bVar1) {
          this->state_ = CLOSED;
          pTVar4 = this;
        }
      }
      else {
        bVar1 = has_syn(payload_size._6_2_);
        pTVar4 = (TCPConnection *)CONCAT71(extraout_var_00,bVar1);
        if (bVar1) {
          this->ack_number_ = *(uint32_t *)(puStack_30 + 2);
          inc_ack_number(this,1);
          local_82._0_2_ = 0x1000;
          local_82._2_8_ = local_82;
          local_82._10_8_ = 1;
          masks_01._M_len = 0x14;
          masks_01._M_array = (iterator)0x1;
          uVar3 = get_flags((TCPConnection *)local_82._2_8_,masks_01,uVar3);
          send(this,0,(void *)0x0,(ulong)uVar3,__flags);
          this->state_ = ESTABLISHED;
          this->poll_flags_ = this->poll_flags_ | 0x304;
          bVar1 = std::function::operator_cast_to_bool((function *)&this->established_cb_);
          pTVar4 = (TCPConnection *)CONCAT71(extraout_var_01,bVar1);
          if (bVar1) {
            std::function<void_(int)>::operator()(&this->established_cb_,0);
            pTVar4 = extraout_RAX;
          }
        }
      }
    }
    else {
      bVar1 = has_rst(payload_size._6_2_);
      if (bVar1) {
        if (this->state_ - ESTABLISHED < 4) {
          this->state_ = CLOSED;
          return (ssize_t)this;
        }
        if (this->state_ - CLOSING < 3) {
          this->state_ = CLOSED;
          return (ssize_t)this;
        }
      }
      bVar1 = has_syn(payload_size._6_2_);
      iVar9 = (int)uVar8;
      uVar3 = (uint16_t)lVar6;
      if ((bVar1) && (this->state_ - SYN_RECEIVED < 8)) {
        inc_ack_number(this,1);
        lck0._12_2_ = 0x400;
        lck0._14_2_ = 0x1000;
        masks_02._M_len = 0x14;
        masks_02._M_array = (iterator)0x2;
        uVar3 = get_flags((TCPConnection *)&lck0.field_0xc,masks_02,uVar3);
        send(this,0,(void *)0x0,(ulong)uVar3,iVar9);
        this->state_ = CLOSED;
        pTVar4 = this;
      }
      else {
        bVar1 = has_ack(payload_size._6_2_);
        pTVar4 = (TCPConnection *)CONCAT71(extraout_var_02,bVar1);
        if (bVar1) {
          lck0._8_4_ = ntohl(*(uint32_t *)(puStack_30 + 4));
          do {
            bVar1 = std::
                    deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                    ::empty(&this->send_buf_);
            iVar9 = (int)uVar8;
            uVar3 = (uint16_t)lVar6;
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&p,&this->_read_m);
            pvVar5 = std::
                     deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                     ::front(&this->send_buf_);
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&p);
            puVar10 = pvVar5->first;
            __netlong = nl_add_hl(*(uint32_t *)(puVar10 + 4),(uint32_t)pvVar5->second);
            lck1._12_4_ = ntohl(__netlong);
            if ((uint)lck0._8_4_ < (uint)lck1._12_4_) {
              lck._12_4_ = 5;
            }
            else {
              bVar1 = has_fin(*(uint16_t *)(puVar10 + 0xc));
              if (bVar1) {
                if (this->state_ == FIN_WAIT_1) {
                  this->state_ = FIN_WAIT_2;
                }
                else if (this->state_ == LAST_ACK) {
                  this->state_ = CLOSED;
                  bVar1 = std::function::operator_cast_to_bool((function *)&this->close_cb_);
                  if (bVar1) {
                    std::function<void_(int)>::operator()(&this->close_cb_,0);
                  }
                }
              }
              if (pvVar5->first != (uchar *)0x0) {
                operator_delete__(pvVar5->first);
              }
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)local_d8,&this->_read_m);
              std::
              deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
              ::pop_front(&this->send_buf_);
              std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_d8);
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
              lck._12_4_ = 0;
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&p);
            iVar9 = (int)uVar8;
            uVar3 = (uint16_t)lVar6;
          } while (lck._12_4_ == 0);
          if (local_52._18_8_ != 0) {
            std::unique_lock<std::mutex>::unique_lock
                      ((unique_lock<std::mutex> *)&payload,&this->_read_m);
            local_f8 = len_local + payload_size._4_2_;
            std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
                      (&local_138,&this->_recv_buf);
            std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
            _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                      ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                       &local_118,&local_138);
            puVar10 = (uchar *)(local_f8 + local_52._18_8_);
            uVar7 = local_f8;
            std::deque<unsigned_char,std::allocator<unsigned_char>>::
            insert<unsigned_char_const*,void>
                      (&local_158,
                       (deque<unsigned_char,std::allocator<unsigned_char>> *)&this->_recv_buf,
                       &local_118,(uchar *)local_f8,puVar10);
            iVar9 = (int)puVar10;
            uVar8 = CONCAT71((int7)((ulong)uVar7 >> 8),(char)this->poll_flags_) | 0xc3;
            uVar3 = (uint16_t)uVar8;
            *(char *)&this->poll_flags_ = (char)uVar8;
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&payload);
            inc_ack_number(this,local_52._18_4_);
            local_182._24_2_ = 0x1000;
            local_168 = (TCPConnection *)(local_182 + 0x18);
            local_160 = 1;
            masks_03._M_len = 0x14;
            masks_03._M_array = (iterator)0x1;
            uVar3 = get_flags(local_168,masks_03,uVar3);
            uVar8 = (ulong)uVar3;
            send(this,0,(void *)0x0,uVar8,iVar9);
            uVar3 = (uint16_t)uVar8;
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&payload);
          }
          bVar1 = has_fin(payload_size._6_2_);
          pTVar4 = (TCPConnection *)CONCAT71(extraout_var_03,bVar1);
          if (bVar1) {
            inc_ack_number(this,1);
            local_182._0_2_ = 0x1000;
            local_182._2_8_ = local_182;
            local_182._10_8_ = 1;
            masks_04._M_len = 0x14;
            masks_04._M_array = (iterator)0x1;
            uVar3 = get_flags((TCPConnection *)local_182._2_8_,masks_04,uVar3);
            send(this,0,(void *)0x0,(ulong)uVar3,iVar9);
            switch(this->state_) {
            case SYN_RECEIVED:
            case ESTABLISHED:
              this->state_ = CLOSE_WAIT;
              break;
            case FIN_WAIT_1:
            case FIN_WAIT_2:
              this->state_ = TIME_WAIT;
              local_198.this = this;
              std::thread::
              thread<TCPConnection::recv(unsigned_char_const*,unsigned_long,unsigned_int)::__0,,void>
                        (&local_190,&local_198);
              std::thread::detach();
              std::thread::~thread(&local_190);
              break;
            case CLOSE_WAIT:
            case CLOSING:
            case LAST_ACK:
              break;
            case TIME_WAIT:
            }
            this->poll_flags_ = this->poll_flags_ | 0xc3;
            pTVar4 = this;
          }
        }
      }
    }
  }
  return (ssize_t)pTVar4;
}

Assistant:

void TCPConnection::recv(uint8_t const *data, size_t len, uint32_t from_ip) noexcept {
    auto *tcp = reinterpret_cast<tcp_t const *>(data);
    uint16_t flags = tcp->flags;
    uint16_t header_len = ((flags & 0x00f0) >> 4) * 4;
    if (header_len > len) {
        std::cerr << "malformed TCP segment. Size too small." << std::endl;
        return;
    }

    size_t payload_size = len - header_len;

    // step 1 If the state is CLOSED
    if (state_ == State::CLOSED) {
        send(nullptr, 0,
             has_ack(flags) ? get_flags({RST_MASK}) : get_flags({RST_MASK, ACK_MASK}),
             ntohs(tcp->dst_port),
             ntohs(tcp->src_port),
             has_ack(flags) ? tcp->ack : 0,
             has_ack(flags) ? 0 : nl_add_hl(tcp->seq, payload_size),
             src_ip_,
             from_ip
        );
        return;
    }

    // step 2   If the state is LISTEN then

    // step 3   If the state is SYN-SENT then
    if (state_ == State::SYN_SENT) {
        if (has_ack(flags)) {
            //  If SEG.ACK =< ISS, or SEG.ACK > SND.NXT, send a reset (unless
            //  the RST bit is set, if so drop the segment and return)
        }

        if (has_rst(flags)) {
            if (has_ack(flags)) {
                // signal the user "error: connection reset"
                state_ = State::CLOSED;
            }
            return;
        }

        if (has_syn(flags)) {
            ack_number_ = tcp->seq;
            inc_ack_number(1);
            send(nullptr, 0, get_flags({ACK_MASK}));
            state_ = State::ESTABLISHED;
            poll_flags_ |= (POLLOUT | POLLWRNORM | POLLWRBAND);
            if (established_cb_) {
                established_cb_(0);
            }
        }
        return;
    }

    // otherwise
    // first check sequence number
    if (has_rst(flags)) {
        switch (state_) {
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
//                If the RST bit is set then, any outstanding RECEIVEs and SEND
//                should receive "reset" responses.  All segment queues should be
//                flushed.  Users should also receive an unsolicited general
//                "connection reset" signal.  Enter the CLOSED state, delete the
//                TCB, and return.
                state_ = State::CLOSED;
                return;
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                state_ = State::CLOSED;
                return;
        }
    }

    if (has_syn(flags)) {
        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                inc_ack_number(1);
                send(nullptr, 0, get_flags({RST_MASK, ACK_MASK}));
                state_ = State::CLOSED;
                return;
        }
    }

    if (!has_ack(flags)) {
        return;
    }

    uint32_t acked = ntohl(tcp->ack);
    while (!send_buf_.empty()) {
        std::unique_lock lck0(_read_m);
        auto &p = send_buf_.front();
        lck0.unlock();
        auto *packet = reinterpret_cast<tcp_t *>(p.first);
        uint32_t next_seq = ntohl(nl_add_hl(packet->seq, p.second));
        if (next_seq <= acked) {
            if (has_fin(packet->flags)) {
                if (state_ == State::FIN_WAIT_1) {
                    state_ = State::FIN_WAIT_2;
                } else if (state_ == State::LAST_ACK) {
                    state_ = State::CLOSED;
                    if (close_cb_) {
                        close_cb_(0);
                    }
                }
            }
            delete[] p.first;
            std::unique_lock lck1(_read_m);
            send_buf_.pop_front();
            lck1.unlock();
        } else {
            break;
        }
    }

    if (payload_size > 0) {
        std::unique_lock<std::mutex> lck(_read_m);
        uint8_t const *payload = data + header_len;
        _recv_buf.insert(_recv_buf.end(), payload, payload + payload_size);
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
        lck.unlock();
        inc_ack_number(payload_size);
        send(nullptr, 0, get_flags({ACK_MASK}));
    }

    if (has_fin(flags)) {
        inc_ack_number(1);
        send(nullptr, 0, get_flags({ACK_MASK}));

        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
                state_ = State::CLOSE_WAIT;
                break;
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
                state_ = State::TIME_WAIT;
                std::thread([&] {
                    std::this_thread::sleep_for(std::chrono::milliseconds(1000 * 2));
                    state_ = State::CLOSED;
                }).detach();
                break;
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
                break;
            case State::TIME_WAIT:
                break;
        }
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
    }
}